

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O2

void __thiscall Fl_Window_Type::read_property(Fl_Window_Type *this,char *c)

{
  int iVar1;
  Fl_Window *pFVar2;
  char *pcVar3;
  int MH;
  int MW;
  int mh;
  int mw;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  iVar1 = strcmp(c,"modal");
  if (iVar1 == 0) {
    this->modal = '\x01';
  }
  else {
    iVar1 = strcmp(c,"non_modal");
    if (iVar1 == 0) {
      this->non_modal = '\x01';
    }
    else {
      iVar1 = strcmp(c,"visible");
      if (iVar1 == 0) {
        pFVar2 = Fl::first_window();
        if (pFVar2 != (Fl_Window *)0x0) {
          (*(this->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0xb])(this);
          return;
        }
      }
      else {
        iVar1 = strcmp(c,"noborder");
        if (iVar1 == 0) {
          Fl_Window::border((Fl_Window *)(this->super_Fl_Widget_Type).o,0);
          return;
        }
        iVar1 = strcmp(c,"xclass");
        if (iVar1 == 0) {
          pcVar3 = read_word(0);
          storestring(pcVar3,&(this->super_Fl_Widget_Type).xclass,0);
          Fl_Window::xclass((Fl_Window *)(this->super_Fl_Widget_Type).o,
                            (this->super_Fl_Widget_Type).xclass);
          return;
        }
        iVar1 = strcmp(c,"size_range");
        if (iVar1 == 0) {
          pcVar3 = read_word(0);
          iVar1 = __isoc99_sscanf(pcVar3,"%d %d %d %d",&local_1c,&local_20,&local_24,&local_28);
          if (iVar1 == 4) {
            this->sr_min_w = local_1c;
            this->sr_min_h = local_20;
            this->sr_max_w = local_24;
            this->sr_max_h = local_28;
          }
        }
        else {
          iVar1 = strcmp(c,"xywh");
          Fl_Widget_Type::read_property(&this->super_Fl_Widget_Type,c);
          if (iVar1 == 0) {
            pasteoffset = 0;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Fl_Window_Type::read_property(const char *c) {
  if (!strcmp(c,"modal")) {
    modal = 1;
  } else if (!strcmp(c,"non_modal")) {
    non_modal = 1;
  } else if (!strcmp(c, "visible")) {
    if (Fl::first_window()) open(); // only if we are using user interface
  } else if (!strcmp(c,"noborder")) {
    ((Fl_Window*)o)->border(0);
  } else if (!strcmp(c,"xclass")) {
    storestring(read_word(),xclass);
    ((Fl_Window*)o)->xclass(xclass);
  } else if (!strcmp(c,"size_range")) {
    int mw, mh, MW, MH;
    if (sscanf(read_word(),"%d %d %d %d",&mw,&mh,&MW,&MH) == 4) {
      sr_min_w = mw; sr_min_h = mh; sr_max_w = MW; sr_max_h = MH;
    }
  } else if (!strcmp(c,"xywh")) {
    Fl_Widget_Type::read_property(c);
    pasteoffset = 0; // make it not apply to contents
  } else {
    Fl_Widget_Type::read_property(c);
  }
}